

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall
QPlainTextDocumentLayoutPrivate::QPlainTextDocumentLayoutPrivate
          (QPlainTextDocumentLayoutPrivate *this)

{
  QAbstractTextDocumentLayoutPrivate::QAbstractTextDocumentLayoutPrivate
            (&this->super_QAbstractTextDocumentLayoutPrivate);
  *(undefined ***)this = &PTR__QAbstractTextDocumentLayoutPrivate_007d6b00;
  this->mainViewPrivate = (QPlainTextEditPrivate *)0x0;
  this->width = 0.0;
  this->maximumWidth = 0.0;
  this->maximumWidthBlockNumber = 0;
  this->blockCount = 1;
  this->blockUpdate = false;
  this->blockDocumentSizeChanged = false;
  this->cursorWidth = 1;
  this->textLayoutFlags = 0;
  return;
}

Assistant:

QPlainTextDocumentLayoutPrivate() {
        mainViewPrivate = nullptr;
        width = 0;
        maximumWidth = 0;
        maximumWidthBlockNumber = 0;
        blockCount = 1;
        blockUpdate = blockDocumentSizeChanged = false;
        cursorWidth = 1;
        textLayoutFlags = 0;
    }